

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

void __thiscall
llama_model_loader::get_mapping_range
          (llama_model_loader *this,size_t *first,size_t *last,void **addr,int idx,ggml_context *ctx
          )

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  llama_tensor_weight *plVar4;
  unsigned_long *puVar5;
  undefined8 *in_RCX;
  unsigned_long *in_RDX;
  unsigned_long *in_RSI;
  uint in_R8D;
  undefined8 in_R9;
  char *unaff_retaddr;
  llama_model_loader *in_stack_00000008;
  llama_tensor_weight *weight;
  ggml_tensor *tensor;
  value_type *mapping;
  size_type in_stack_ffffffffffffff98;
  vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  *in_stack_ffffffffffffffa0;
  vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  *in_stack_ffffffffffffffb0;
  long local_40;
  
  bVar1 = std::
          vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
          ::empty(in_stack_ffffffffffffffb0);
  if (bVar1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
               ,0x34d,"GGML_ASSERT(%s) failed","!mappings.empty()");
  }
  std::
  vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
            ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x451e9e);
  sVar2 = llama_mmap::size((llama_mmap *)0x451ea6);
  *in_RSI = sVar2;
  *in_RDX = 0;
  std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
            ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x451ec7);
  pvVar3 = llama_mmap::addr((llama_mmap *)0x451ecf);
  *in_RCX = pvVar3;
  for (local_40 = ggml_get_first_tensor(in_R9); local_40 != 0;
      local_40 = ggml_get_next_tensor(in_R9,local_40)) {
    ggml_get_name(local_40);
    plVar4 = get_weight(in_stack_00000008,unaff_retaddr);
    if ((plVar4 != (llama_tensor_weight *)0x0) && (plVar4->idx == in_R8D)) {
      puVar5 = std::min<unsigned_long>(in_RSI,&plVar4->offs);
      *in_RSI = *puVar5;
      puVar5 = in_RDX;
      ggml_nbytes(local_40);
      puVar5 = std::max<unsigned_long>(puVar5,(unsigned_long *)&stack0xffffffffffffffb0);
      *in_RDX = *puVar5;
    }
  }
  return;
}

Assistant:

void llama_model_loader::get_mapping_range(size_t * first, size_t * last, void ** addr, int idx, ggml_context * ctx) const {
    GGML_ASSERT(!mappings.empty());
    const auto & mapping = mappings.at(idx);

    *first = mapping->size();
    *last  = 0;
    *addr = mapping->addr();
    for (ggml_tensor * tensor = ggml_get_first_tensor(ctx); tensor; tensor = ggml_get_next_tensor(ctx, tensor)) {
        const auto * weight = get_weight(ggml_get_name(tensor));
        if (!weight || weight->idx != idx) {
            continue;
        }
        *first = std::min(*first, weight->offs);
        *last  = std::max(*last,  weight->offs + ggml_nbytes(tensor));
    }
}